

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethpccal.cpp
# Opt level: O3

void __thiscall
icu_63::EthiopicCalendar::handleComputeFields
          (EthiopicCalendar *this,int32_t julianDay,UErrorCode *param_2)

{
  int iVar1;
  uint uVar2;
  int32_t day;
  int32_t month;
  int32_t eyear;
  int local_24;
  int local_20;
  int local_1c;
  
  iVar1 = (*(this->super_CECalendar).super_Calendar.super_UObject._vptr_UObject[0x32])();
  CECalendar::jdToCE(julianDay,iVar1,&local_1c,&local_20,&local_24);
  iVar1 = local_1c + 0x157c;
  if (*(int *)&(this->super_CECalendar).super_Calendar.field_0x264 == 1) {
    uVar2 = 0;
  }
  else {
    uVar2 = (uint)(0 < local_1c);
    if (0 < local_1c) {
      iVar1 = local_1c;
    }
  }
  (this->super_CECalendar).super_Calendar.fFields[0x13] = local_1c;
  (this->super_CECalendar).super_Calendar.fStamp[0x13] = 1;
  (this->super_CECalendar).super_Calendar.fIsSet[0x13] = '\x01';
  (this->super_CECalendar).super_Calendar.fFields[0] = uVar2;
  (this->super_CECalendar).super_Calendar.fStamp[0] = 1;
  (this->super_CECalendar).super_Calendar.fStamp[1] = 1;
  (this->super_CECalendar).super_Calendar.fIsSet[0] = '\x01';
  (this->super_CECalendar).super_Calendar.fIsSet[1] = '\x01';
  (this->super_CECalendar).super_Calendar.fFields[1] = iVar1;
  (this->super_CECalendar).super_Calendar.fFields[2] = local_20;
  (this->super_CECalendar).super_Calendar.fStamp[2] = 1;
  (this->super_CECalendar).super_Calendar.fIsSet[2] = '\x01';
  (this->super_CECalendar).super_Calendar.fFields[5] = local_24;
  (this->super_CECalendar).super_Calendar.fStamp[5] = 1;
  (this->super_CECalendar).super_Calendar.fStamp[6] = 1;
  (this->super_CECalendar).super_Calendar.fIsSet[5] = '\x01';
  (this->super_CECalendar).super_Calendar.fIsSet[6] = '\x01';
  (this->super_CECalendar).super_Calendar.fFields[6] = local_20 * 0x1e + local_24;
  return;
}

Assistant:

void
EthiopicCalendar::handleComputeFields(int32_t julianDay, UErrorCode &/*status*/)
{
    int32_t eyear, month, day, era, year;
    jdToCE(julianDay, getJDEpochOffset(), eyear, month, day);

    if (isAmeteAlemEra()) {
        era = AMETE_ALEM;
        year = eyear + AMETE_MIHRET_DELTA;
    } else {
        if (eyear > 0) {
            era = AMETE_MIHRET;
            year = eyear;
        } else {
            era = AMETE_ALEM;
            year = eyear + AMETE_MIHRET_DELTA;
        }
    }

    internalSet(UCAL_EXTENDED_YEAR, eyear);
    internalSet(UCAL_ERA, era);
    internalSet(UCAL_YEAR, year);
    internalSet(UCAL_MONTH, month);
    internalSet(UCAL_DATE, day);
    internalSet(UCAL_DAY_OF_YEAR, (30 * month) + day);
}